

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
msc::
mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
          (undefined8 param_1,double param_2,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,msc *this,msc *first,uint param_6,int dim)

{
  long lVar1;
  long lVar2;
  pointer pvVar3;
  double *a;
  bool bVar4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar5;
  double dVar6;
  invalid_argument *this_00;
  ulong uVar7;
  int iVar8;
  L2Sq local_81;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_80;
  msc *local_78;
  msc *local_70;
  double local_68;
  int local_5c;
  double local_58;
  undefined8 local_50;
  vector<double,_std::allocator<double>_> point;
  
  local_5c = dim;
  local_58 = param_2;
  local_50 = param_1;
  if ((int)param_6 < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_80 = __return_storage_ptr__;
  local_70 = first;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)first - (long)this) / 0x18,(allocator_type *)&point);
  pvVar5 = local_80;
  dVar6 = 0.0;
  for (local_78 = this; local_78 != local_70; local_78 = local_78 + 0x18) {
    lVar1 = *(long *)local_78;
    local_68 = dVar6;
    std::vector<double,_std::allocator<double>_>::resize
              ((pvVar5->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + (long)dVar6,(ulong)param_6);
    lVar2 = *(long *)&(pvVar5->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[(long)dVar6].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    for (uVar7 = 0; param_6 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined8 *)(lVar2 + uVar7 * 8) = *(undefined8 *)(lVar1 + uVar7 * 8);
    }
    dVar6 = (double)((long)local_68 + 1);
  }
  uVar7 = 0;
  do {
    pvVar3 = (local_80->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_80->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <= uVar7)
    {
      return local_80;
    }
    a = pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
    local_78 = (msc *)uVar7;
    iVar8 = 1;
    do {
      mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
                (local_50,(msc *)&point,a,this,local_70,param_6);
      local_68 = metrics::L2Sq::operator()
                           (&local_81,a,
                            point.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,param_6);
      std::vector<double,_std::allocator<double>_>::operator=
                ((local_80->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar7,&point);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&point);
      if (local_68 <= local_58) break;
      bVar4 = iVar8 < local_5c;
      iVar8 = iVar8 + 1;
    } while (bVar4);
    uVar7 = (long)local_78 + 1;
  } while( true );
}

Assistant:

inline std::vector<std::vector<T>> mean_shift(
    ForwardIterator first, ForwardIterator last, int dim,
    Metric metric, Kernel kernel, Estimator estimator,
    double epsilon = std::numeric_limits<float>::epsilon(),
    int max_iter = std::numeric_limits<int>::max())
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<ForwardIterator>::value_type C;
    std::vector<std::vector<T>> shifted(std::distance(first, last));
    std::size_t i = 0;
    for (auto it = first; it != last; it++, i++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        shifted[i].resize(dim);
        for (int k = 0; k < dim; k++)
            shifted[i][k] = pt[k];
    }

    #pragma omp parallel for
    for (std::size_t i = 0; i < shifted.size(); i++)
    {
        const T* pt = shifted[i].data();
        int iter = 0;
        double d = 0;
        do
        {
            const auto point = mean_shift(
                pt, first, last, dim, metric, kernel, estimator);
            d = metric(pt, point.data(), dim);
            shifted[i] = point;
            iter++;
        }
        while (d > epsilon && iter < max_iter);
    }

    return shifted;
}